

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_opt2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 ZSTD_dictMode_e dictMode)

{
  int iVar1;
  ZSTD_optimal_t *pZVar2;
  undefined8 uVar3;
  BYTE *pBVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ZSTD_match_t *matches;
  optState_t *poVar8;
  BYTE *ip;
  U32 UVar9;
  U32 UVar10;
  U32 UVar11;
  U32 UVar12;
  uint uVar13;
  uint uVar14;
  U32 *pUVar15;
  seqDef *psVar16;
  ulong uVar17;
  ulong uVar18;
  ZSTD_optimal_t *pZVar19;
  uint uVar20;
  uint uVar21;
  rawSeqStore_t *prVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  U32 storePos;
  ulong uVar26;
  uint uVar27;
  undefined8 *puVar28;
  uint uVar29;
  BYTE *pBVar30;
  U32 UVar31;
  int iVar33;
  ulong uVar34;
  repcodes_t rVar35;
  BYTE *local_130;
  U32 nbMatches;
  ulong local_120;
  ZSTD_match_t *local_118;
  optState_t *local_110;
  BYTE *local_108;
  uint local_fc;
  BYTE *local_f8;
  ZSTD_optimal_t *local_f0;
  U32 local_e4;
  uint local_e0;
  U32 nextToUpdate3;
  undefined8 local_d8;
  U32 local_d0;
  ulong local_c8;
  U32 (*local_c0) [3];
  ulong local_b8;
  U32 local_b0;
  U32 local_ac;
  BYTE *local_a8;
  seqStore_t *local_a0;
  ZSTD_getAllMatchesFn local_98;
  void *local_90;
  BYTE *local_88;
  U32 *local_80;
  ulong local_78;
  U32 *local_70;
  ZSTD_optLdm_t optLdm;
  int iVar32;
  
  local_f8 = (BYTE *)((long)src + srcSize);
  local_88 = (BYTE *)((long)src + (srcSize - 8));
  uVar21 = (ms->window).dictLimit;
  pBVar30 = (ms->window).base;
  local_c0 = (U32 (*) [3])rep;
  local_a0 = seqStore;
  local_98 = ZSTD_selectBtGetAllMatches(ms,dictMode);
  uVar13 = (ms->cParams).targetLength;
  local_e0 = 0xfff;
  if (uVar13 < 0xfff) {
    local_e0 = uVar13;
  }
  nextToUpdate3 = ms->nextToUpdate;
  local_118 = (ms->opt).matchTable;
  pZVar2 = (ms->opt).priceTable;
  local_d8 = 0;
  local_d0 = 0;
  local_b8 = (ulong)(((ms->cParams).minMatch != 3) + 3);
  prVar22 = (rawSeqStore_t *)kNullRawSeqStore;
  if (ms->ldmSeqStore != (rawSeqStore_t *)0x0) {
    prVar22 = ms->ldmSeqStore;
  }
  optLdm.seqStore.capacity = prVar22->capacity;
  optLdm.seqStore.seq = prVar22->seq;
  optLdm.seqStore.pos = prVar22->pos;
  optLdm.seqStore.posInSequence = prVar22->posInSequence;
  optLdm.seqStore.size = prVar22->size;
  optLdm.offset = 0;
  optLdm.startPosInBlock = 0;
  optLdm.endPosInBlock = 0;
  ZSTD_opt_getNextMatchAndUpdateSeqStore(&optLdm,0,(U32)srcSize);
  uVar18 = 0;
  local_110 = &ms->opt;
  ZSTD_rescaleFreqs(&ms->opt,(BYTE *)src,srcSize,2);
  local_130 = (BYTE *)((ulong)(pBVar30 + uVar21 == (BYTE *)src) + (long)src);
  local_70 = pZVar2->rep;
  local_a8 = (BYTE *)((long)src + (srcSize - 0x20));
  local_80 = &pZVar2[1].litlen;
  local_90 = src;
LAB_01bdbf42:
  local_78 = (ulong)(1 - (int)src);
  local_fc = (uint)uVar18;
  local_108 = (BYTE *)src;
  do {
    UVar9 = (int)local_78 + (int)local_130;
    while( true ) {
      pBVar30 = local_f8;
      matches = local_118;
      if (local_88 <= local_130) {
        return (long)local_f8 - (long)local_108;
      }
      iVar32 = (int)local_130;
      UVar31 = iVar32 - (int)local_108;
      nbMatches = (*local_98)(local_118,ms,&nextToUpdate3,local_130,local_f8,*local_c0,
                              SUB14(UVar31 == 0,0),(U32)local_b8);
      ZSTD_optLdm_processMatchCandidate
                (&optLdm,matches,&nbMatches,iVar32 - (int)local_90,(int)pBVar30 - iVar32);
      UVar11 = nbMatches;
      uVar18 = (ulong)nbMatches;
      if (uVar18 != 0) break;
      local_130 = local_130 + 1;
      UVar9 = UVar9 + 1;
    }
    pZVar2->mlen = 0;
    pZVar2->litlen = UVar31;
    UVar10 = ZSTD_litLengthPrice(UVar31,local_110,2);
    pZVar2->price = UVar10;
    local_70[2] = (*local_c0)[2];
    *(undefined8 *)local_70 = *(undefined8 *)*local_c0;
    uVar21 = local_118[UVar11 - 1].len;
    if (local_e0 < uVar21) {
      UVar9 = local_118[UVar11 - 1].off;
      uVar18 = 0;
      goto LAB_01bdc7f1;
    }
    pUVar15 = local_80;
    for (uVar26 = 1; uVar26 < local_b8; uVar26 = uVar26 + 1) {
      ((ZSTD_optimal_t *)(pUVar15 + -3))->price = 0x40000000;
      pUVar15[-1] = 0;
      *pUVar15 = UVar9;
      UVar9 = UVar9 + 1;
      pUVar15 = pUVar15 + 7;
    }
    local_c8 = uVar18;
    for (uVar17 = 0; uVar17 != local_c8; uVar17 = uVar17 + 1) {
      uVar21 = local_118[uVar17].off;
      uVar13 = local_118[uVar17].len;
      uVar25 = 0x1f;
      if (uVar21 != 0) {
        for (; uVar21 >> uVar25 == 0; uVar25 = uVar25 - 1) {
        }
      }
      uVar24 = (int)uVar26 * 0x100 - 0x200;
      while (uVar14 = (uint)uVar26, uVar14 <= uVar13) {
        if ((ms->opt).priceType == zop_predef) {
          iVar33 = 0x1f;
          if (uVar14 - 2 != 0) {
            for (; uVar14 - 2 >> iVar33 == 0; iVar33 = iVar33 + -1) {
            }
          }
          iVar33 = (uVar24 >> ((byte)iVar33 & 0x1f)) + (iVar33 + uVar25) * 0x100 + 0x1000;
        }
        else {
          uVar27 = uVar14 - 3;
          uVar20 = (ms->opt).offCodeFreq[uVar25] + 1;
          iVar33 = 0x1f;
          if (uVar20 != 0) {
            for (; uVar20 >> iVar33 == 0; iVar33 = iVar33 + -1) {
            }
          }
          if (uVar27 < 0x80) {
            uVar27 = (uint)(byte)(&ZSTD_MLcode(unsigned_int)::ML_Code)[uVar27];
          }
          else {
            uVar29 = 0x1f;
            if (uVar27 != 0) {
              for (; uVar27 >> uVar29 == 0; uVar29 = uVar29 - 1) {
              }
            }
            uVar27 = (uVar29 ^ 0xffffffe0) + 0x44;
          }
          uVar29 = (ms->opt).matchLengthFreq[uVar27] + 1;
          iVar1 = 0x1f;
          if (uVar29 != 0) {
            for (; uVar29 >> iVar1 == 0; iVar1 = iVar1 + -1) {
            }
          }
          iVar33 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                   ((uVar20 * 0x100 >> ((byte)iVar33 & 0x1f)) +
                   (uVar29 * 0x100 >> ((byte)iVar1 & 0x1f)))) +
                   (((byte)ML_bits[uVar27] + uVar25) - (iVar33 + iVar1)) * 0x100 + 0x33;
        }
        iVar1 = pZVar2->price;
        uVar26 = uVar26 & 0xffffffff;
        pZVar2[uVar26].mlen = uVar14;
        pZVar2[uVar26].off = uVar21;
        pZVar2[uVar26].litlen = 0;
        UVar9 = ZSTD_litLengthPrice(0,local_110,2);
        pZVar2[uVar26].price = UVar9 + iVar33 + iVar1;
        uVar24 = uVar24 + 0x100;
        uVar26 = (ulong)(uVar14 + 1);
      }
    }
    uVar17 = (ulong)((int)uVar26 - 1);
    pZVar2[uVar26 & 0xffffffff].price = 0x40000000;
    uVar18 = 1;
    while( true ) {
      poVar8 = local_110;
      uVar25 = (uint)uVar18;
      uVar13 = (uint)uVar17;
      if (uVar13 < uVar25) break;
      pBVar30 = local_130 + uVar18;
      uVar26 = (ulong)(uVar25 - 1);
      local_120 = uVar26 * 0x1c;
      iVar33 = pZVar2[uVar26].price;
      UVar9 = pZVar2[uVar26].litlen;
      UVar31 = UVar9 + 1;
      local_c8 = uVar18;
      UVar11 = ZSTD_rawLiteralsCost
                         (local_130 + (uVar18 - 1),(U32)local_110,(optState_t *)0x2,iVar32);
      UVar10 = ZSTD_litLengthPrice(UVar31,poVar8,2);
      UVar12 = ZSTD_litLengthPrice(UVar9,poVar8,2);
      poVar8 = local_110;
      uVar21 = (UVar10 - UVar12) + UVar11 + iVar33;
      pZVar19 = pZVar2 + local_c8;
      uVar34 = (ulong)(uint)pZVar2[local_c8].price;
      if (pZVar2[local_c8].price < (int)uVar21) {
        UVar31 = pZVar19->litlen;
      }
      else {
        puVar28 = (undefined8 *)((long)pZVar2->rep + (local_120 - 0x10));
        UVar11 = pZVar19->off;
        UVar10 = pZVar19->mlen;
        uVar3 = *puVar28;
        uVar5 = puVar28[1];
        uVar6 = *(undefined8 *)((long)puVar28 + 0xc);
        uVar7 = *(undefined8 *)((long)puVar28 + 0x14);
        UVar12 = pZVar19->litlen;
        pZVar19->litlen = (int)uVar6;
        pZVar19->rep[0] = (int)((ulong)uVar6 >> 0x20);
        *(undefined8 *)(pZVar19->rep + 1) = uVar7;
        pZVar19->price = (int)uVar3;
        pZVar19->off = (int)((ulong)uVar3 >> 0x20);
        pZVar19->mlen = (int)uVar5;
        pZVar19->litlen = (int)((ulong)uVar5 >> 0x20);
        pZVar19->litlen = UVar31;
        pZVar19->price = uVar21;
        if (UVar12 == 0) {
          local_120 = uVar34;
          local_f0 = pZVar19;
          local_e4 = UVar10;
          local_ac = UVar11;
          UVar11 = ZSTD_litLengthPrice(1,local_110,2);
          iVar33 = (int)pZVar19;
          UVar10 = ZSTD_litLengthPrice(0,poVar8,2);
          poVar8 = local_110;
          if (((int)UVar11 < (int)UVar10) && (pBVar30 < local_f8)) {
            local_b0 = ZSTD_rawLiteralsCost(pBVar30,(U32)local_110,(optState_t *)0x2,iVar33);
            iVar33 = (UVar11 - UVar10) + local_b0 + (int)local_120;
            UVar11 = ZSTD_litLengthPrice(UVar9 + 2,poVar8,2);
            UVar10 = ZSTD_litLengthPrice(UVar31,poVar8,2);
            UVar9 = local_ac;
            if (iVar33 < (int)((UVar11 + local_b0 + uVar21) - UVar10)) {
              uVar26 = (ulong)(uVar25 + 1);
              if (iVar33 < pZVar2[uVar26].price) {
                pZVar19 = pZVar2 + uVar26;
                local_120 = uVar26;
                rVar35 = ZSTD_newRep(pZVar2[uVar25 - local_e4].rep,local_ac,
                                     (uint)(pZVar2[uVar25 - local_e4].litlen == 0));
                pZVar19->off = UVar9;
                pZVar19->mlen = local_e4;
                *&pZVar19->rep = rVar35.rep;
                uVar26 = local_120;
                if ((uint)local_120 < uVar13) {
                  uVar26 = uVar17;
                }
                uVar17 = uVar26 & 0xffffffff;
                pZVar19->litlen = 1;
                pZVar19->price = iVar33;
              }
            }
          }
          uVar34 = (ulong)uVar21;
          pZVar19 = local_f0;
        }
        else {
          uVar34 = (ulong)uVar21;
        }
      }
      if (UVar31 == 0) {
        uVar21 = uVar25 - pZVar19->mlen;
        rVar35 = ZSTD_newRep(pZVar2[uVar21].rep,pZVar19->off,(uint)(pZVar2[uVar21].litlen == 0));
        *&pZVar19->rep = rVar35.rep;
      }
      if (pBVar30 <= local_88) {
        uVar26 = local_c8;
        uVar13 = uVar25;
        if (uVar25 == (uint)uVar17) goto LAB_01bdc6f4;
        local_120 = uVar34;
        UVar9 = ZSTD_litLengthPrice(0,local_110,2);
        nbMatches = (*local_98)(local_118,ms,&nextToUpdate3,pBVar30,local_f8,pZVar19->rep,
                                SUB14(UVar31 == 0,0),(U32)local_b8);
        ZSTD_optLdm_processMatchCandidate
                  (&optLdm,local_118,&nbMatches,(int)pBVar30 - (int)local_90,
                   (int)local_f8 - (int)pBVar30);
        if ((ulong)nbMatches != 0) {
          uVar21 = local_118[nbMatches - 1].len;
          uVar13 = uVar21 + uVar25;
          if (((local_e0 < uVar21) || (0xfff < uVar13)) || (local_f8 <= pBVar30 + uVar21)) {
            uVar25 = local_fc;
            if (uVar21 == 0) goto LAB_01bdc730;
            UVar9 = local_118[nbMatches - 1].off;
            goto LAB_01bdc7e3;
          }
          for (uVar18 = 0; uVar18 != nbMatches; uVar18 = uVar18 + 1) {
            uVar21 = (uint)local_b8;
            if (uVar18 != 0) {
              uVar21 = local_118[uVar18 - 1].len + 1;
            }
            uVar13 = local_118[uVar18].off;
            UVar31 = local_118[uVar18].len;
            uVar24 = 0x1f;
            if (uVar13 != 0) {
              for (; uVar13 >> uVar24 == 0; uVar24 = uVar24 - 1) {
              }
            }
            for (; uVar21 <= UVar31; UVar31 = UVar31 - 1) {
              if ((ms->opt).priceType == zop_predef) {
                uVar14 = UVar31 - 2;
                iVar33 = 0x1f;
                if (uVar14 != 0) {
                  for (; uVar14 >> iVar33 == 0; iVar33 = iVar33 + -1) {
                  }
                }
                iVar33 = (uVar14 * 0x100 >> ((byte)iVar33 & 0x1f)) + (iVar33 + uVar24) * 0x100 +
                         0x1000;
              }
              else {
                uVar20 = UVar31 - 3;
                uVar14 = (ms->opt).offCodeFreq[uVar24] + 1;
                iVar33 = 0x1f;
                if (uVar14 != 0) {
                  for (; uVar14 >> iVar33 == 0; iVar33 = iVar33 + -1) {
                  }
                }
                if (uVar20 < 0x80) {
                  uVar20 = (uint)(byte)(&ZSTD_MLcode(unsigned_int)::ML_Code)[uVar20];
                }
                else {
                  uVar27 = 0x1f;
                  if (uVar20 != 0) {
                    for (; uVar20 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                    }
                  }
                  uVar20 = (uVar27 ^ 0xffffffe0) + 0x44;
                }
                uVar27 = (ms->opt).matchLengthFreq[uVar20] + 1;
                iVar1 = 0x1f;
                if (uVar27 != 0) {
                  for (; uVar27 >> iVar1 == 0; iVar1 = iVar1 + -1) {
                  }
                }
                iVar33 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                         ((uVar14 * 0x100 >> ((byte)iVar33 & 0x1f)) +
                         (uVar27 * 0x100 >> ((byte)iVar1 & 0x1f)))) +
                         (((byte)ML_bits[uVar20] + uVar24) - (iVar33 + iVar1)) * 0x100 + 0x33;
              }
              iVar33 = iVar33 + UVar9 + (int)local_120;
              uVar26 = (ulong)(UVar31 + uVar25);
              if (((uint)uVar17 < UVar31 + uVar25) || (iVar33 < pZVar2[uVar26].price)) {
                uVar17 = uVar17 & 0xffffffff;
                pUVar15 = local_80 + uVar17 * 7;
                for (; uVar17 < uVar26; uVar17 = uVar17 + 1) {
                  ((ZSTD_optimal_t *)(pUVar15 + -3))->price = 0x40000000;
                  *pUVar15 = 1;
                  pUVar15 = pUVar15 + 7;
                }
                pZVar2[uVar26].mlen = UVar31;
                pZVar2[uVar26].off = uVar13;
                pZVar2[uVar26].litlen = 0;
                pZVar2[uVar26].price = iVar33;
              }
            }
          }
          pZVar2[(int)uVar17 + 1].price = 0x40000000;
        }
      }
      uVar18 = (ulong)(uVar25 + 1);
    }
    uVar26 = uVar17 & 0xffffffff;
    uVar34 = (ulong)(uint)pZVar2[uVar26].price;
    UVar31 = pZVar2[uVar26].litlen;
LAB_01bdc6f4:
    UVar9 = pZVar2[uVar26].off;
    uVar21 = pZVar2[uVar26].mlen;
    local_d0 = pZVar2[uVar26].rep[2];
    local_d8 = *(undefined8 *)pZVar2[uVar26].rep;
    uVar25 = (uint)uVar34;
    if (uVar21 != 0) break;
LAB_01bdc730:
    local_fc = uVar25;
    local_130 = local_130 + uVar13;
  } while( true );
  if (UVar31 == 0) {
    uVar18 = (ulong)(uVar13 - uVar21);
    local_fc = uVar25;
LAB_01bdc7e3:
    UVar31 = pZVar2[uVar18].litlen;
LAB_01bdc7f1:
    rVar35 = ZSTD_newRep(pZVar2[uVar18].rep,UVar9,(uint)(UVar31 == 0));
    *local_c0 = rVar35.rep;
    uVar26 = (ulong)((int)uVar18 + 2);
    UVar31 = 0;
    uVar34 = (ulong)local_fc;
  }
  else {
    uVar3 = *(undefined8 *)pZVar2[uVar26].rep;
    (*local_c0)[2] = pZVar2[uVar26].rep[2];
    *(undefined8 *)*local_c0 = uVar3;
    uVar24 = (uVar13 - uVar21) - UVar31;
    uVar26 = (ulong)(uVar24 + 2);
    pZVar2[uVar26].litlen = UVar31;
    pZVar2[uVar26].mlen = 0;
    uVar13 = uVar24 + 1;
    pZVar2[uVar13].price = uVar25;
    pZVar2[uVar13].off = UVar9;
    pZVar2[uVar13].mlen = uVar21;
    pZVar2[uVar13].litlen = UVar31;
    *(undefined8 *)pZVar2[uVar13].rep = local_d8;
    pZVar2[uVar13].rep[2] = local_d0;
    uVar18 = (ulong)uVar24;
  }
  pZVar2[uVar26].price = (int)uVar34;
  pZVar2[uVar26].off = UVar9;
  pZVar2[uVar26].mlen = uVar21;
  pZVar2[uVar26].litlen = UVar31;
  *(undefined8 *)pZVar2[uVar26].rep = local_d8;
  pZVar2[uVar26].rep[2] = local_d0;
  uVar17 = uVar26;
  while( true ) {
    iVar32 = pZVar2[uVar18].price;
    UVar11 = pZVar2[uVar18].off;
    UVar9 = pZVar2[uVar18].mlen;
    UVar31 = pZVar2[uVar18].litlen;
    pZVar2[uVar17].litlen = UVar31;
    pBVar30 = local_a8;
    local_120 = uVar34;
    if (UVar9 == 0) break;
    uVar17 = (ulong)((int)uVar17 - 1);
    pZVar2[uVar17].price = iVar32;
    pZVar2[uVar17].off = UVar11;
    pZVar2[uVar17].mlen = UVar9;
    pZVar2[uVar17].litlen = UVar31;
    uVar3 = *(undefined8 *)pZVar2[uVar18].rep;
    pZVar2[uVar17].rep[2] = pZVar2[uVar18].rep[2];
    *(undefined8 *)pZVar2[uVar17].rep = uVar3;
    uVar18 = (ulong)((int)uVar18 - (UVar9 + UVar31));
  }
  for (; ip = local_108, uVar18 = local_120, (uint)uVar17 <= (uint)uVar26;
      uVar17 = (ulong)((uint)uVar17 + 1)) {
    uVar21 = pZVar2[uVar17].mlen;
    uVar13 = pZVar2[uVar17].litlen;
    uVar18 = (ulong)uVar13;
    if ((ulong)uVar21 == 0) {
      local_130 = local_108 + uVar18;
    }
    else {
      UVar9 = pZVar2[uVar17].off;
      ZSTD_updateStats(local_110,uVar13,local_108,UVar9,uVar21);
      pBVar4 = local_a0->lit;
      if (pBVar30 < ip + uVar18) {
        ZSTD_safecopyLiterals(pBVar4,ip,ip + uVar18,pBVar30);
LAB_01bdc946:
        local_a0->lit = local_a0->lit + uVar18;
        psVar16 = local_a0->sequences;
        if (0xffff < uVar13) {
          local_a0->longLengthType = ZSTD_llt_literalLength;
          local_a0->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)local_a0->sequencesStart) >> 3);
        }
      }
      else {
        uVar3 = *(undefined8 *)(ip + 8);
        *(undefined8 *)pBVar4 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar4 + 8) = uVar3;
        if (0x10 < uVar13) {
          pBVar30 = local_a0->lit;
          uVar3 = *(undefined8 *)(ip + 0x18);
          *(undefined8 *)(pBVar30 + 0x10) = *(undefined8 *)(ip + 0x10);
          *(undefined8 *)(pBVar30 + 0x18) = uVar3;
          if (0x10 < uVar18 - 0x10) {
            lVar23 = 0;
            do {
              uVar3 = *(undefined8 *)(ip + lVar23 + 0x20 + 8);
              pBVar4 = pBVar30 + lVar23 + 0x20;
              *(undefined8 *)pBVar4 = *(undefined8 *)(ip + lVar23 + 0x20);
              *(undefined8 *)(pBVar4 + 8) = uVar3;
              uVar3 = *(undefined8 *)(ip + lVar23 + 0x30 + 8);
              *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)(ip + lVar23 + 0x30);
              *(undefined8 *)(pBVar4 + 0x18) = uVar3;
              lVar23 = lVar23 + 0x20;
            } while (pBVar4 + 0x20 < pBVar30 + uVar18);
            goto LAB_01bdc946;
          }
        }
        local_a0->lit = local_a0->lit + uVar18;
        psVar16 = local_a0->sequences;
      }
      psVar16->litLength = (U16)uVar13;
      psVar16->offBase = UVar9;
      uVar18 = (ulong)uVar21 - 3;
      if (0xffff < uVar18) {
        local_a0->longLengthType = ZSTD_llt_matchLength;
        local_a0->longLengthPos =
             (U32)((ulong)((long)psVar16 - (long)local_a0->sequencesStart) >> 3);
      }
      psVar16->mlBase = (U16)uVar18;
      local_a0->sequences = psVar16 + 1;
      local_130 = ip + (uVar13 + uVar21);
      pBVar30 = local_a8;
      local_108 = local_130;
    }
  }
  ZSTD_setBasePrices(local_110,2);
  src = local_108;
  goto LAB_01bdbf42;
}

Assistant:

static size_t ZSTD_compressBlock_opt2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize, const ZSTD_dictMode_e dictMode)
{
    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /* optLevel */, dictMode);
}